

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HEkk.cpp
# Opt level: O0

bool __thiscall HEkk::proofOfPrimalInfeasibility(HEkk *this)

{
  byte bVar1;
  long in_RDI;
  HVector row_ep;
  HighsInt row_out;
  HighsInt move_out;
  HighsLp *lp;
  HighsInt in_stack_000001b0;
  HighsInt in_stack_000001b4;
  HVector *in_stack_000001b8;
  HEkk *in_stack_000001c0;
  undefined7 in_stack_ffffffffffffff10;
  undefined1 in_stack_ffffffffffffff17;
  HVectorBase<double> *this_00;
  HighsInt in_stack_ffffffffffffff2c;
  HEkk *in_stack_ffffffffffffff30;
  HVectorBase<double> local_c8;
  undefined4 local_18;
  undefined4 local_14;
  long local_10;
  
  local_10 = in_RDI + 0x2198;
  local_14 = *(undefined4 *)(in_RDI + 0x374c);
  local_18 = *(undefined4 *)(in_RDI + 0x3748);
  this_00 = &local_c8;
  HVectorBase<double>::HVectorBase
            ((HVectorBase<double> *)CONCAT17(in_stack_ffffffffffffff17,in_stack_ffffffffffffff10));
  HVectorBase<double>::setup(this_00,(HighsInt)((ulong)in_RDI >> 0x20));
  unitBtran(in_stack_ffffffffffffff30,in_stack_ffffffffffffff2c,this_00);
  bVar1 = proofOfPrimalInfeasibility
                    (in_stack_000001c0,in_stack_000001b8,in_stack_000001b4,in_stack_000001b0);
  HVectorBase<double>::~HVectorBase
            ((HVectorBase<double> *)CONCAT17(bVar1,in_stack_ffffffffffffff10));
  return (bool)(bVar1 & 1);
}

Assistant:

bool HEkk::proofOfPrimalInfeasibility() {
  // To be called from outside HEkk when row_ep is not known
  assert(dual_ray_record_.index >= 0);
  HighsLp& lp = this->lp_;
  HighsInt move_out = dual_ray_record_.sign;
  HighsInt row_out = dual_ray_record_.index;
  // Compute the basis inverse row
  HVector row_ep;
  row_ep.setup(lp.num_row_);
  unitBtran(row_out, row_ep);
  return proofOfPrimalInfeasibility(row_ep, move_out, row_out);
}